

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.cpp
# Opt level: O3

void __thiscall OS_Socket_Mon_Thread::thread_main(OS_Socket_Mon_Thread *this)

{
  OS_Event *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  int *piVar3;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  __sighandler_t __handler_02;
  OS_Socket_Mon_Thread *t;
  int in_ESI;
  int __sig;
  bool bVar4;
  pollfd fd [2];
  pollfd local_28;
  int local_20;
  undefined2 local_1c;
  short local_1a;
  
  iVar2 = pipe(this->qpipe);
  if (iVar2 != -1) {
    while( true ) {
      pOVar1 = this->s->blocked_evt;
      iVar2 = (*(pOVar1->super_OS_Waitable)._vptr_OS_Waitable[2])(&pOVar1->super_OS_Waitable);
      OS_Event::evt_wait((OS_Event *)CONCAT44(extraout_var,iVar2));
      local_28.fd = this->s->s;
      local_28.events = 0x14 - (ushort)(this->s->wouldblock_sending == 0);
      local_20 = this->qpipe[0];
      local_1c = 1;
      __sig = 2;
      iVar2 = poll(&local_28,2,-1);
      __handler = extraout_RDX;
      if (((iVar2 < 0) && (piVar3 = __errno_location(), __handler = extraout_RDX_00, *piVar3 != 4))
         || (local_1a != 0)) break;
      bVar4 = local_28.revents == 0;
      OS_Event::reset((&this->s->ready_evt)[!bVar4]);
      OS_Event::signal((&this->s->ready_evt)[bVar4],__sig,__handler_00);
    }
    OS_Event::signal(this->s->blocked_evt,__sig,__handler);
    OS_Event::signal(this->s->ready_evt,__sig,__handler_01);
    return;
  }
  OS_CoreSocket::close(this->s,in_ESI);
  OS_Event::signal(this->s->ready_evt,in_ESI,__handler_02);
  return;
}

Assistant:

void thread_main()
    {
        /* create the quit notifier pipe */
        if (pipe(qpipe) == -1)
        {
            s->close();
            s->ready_evt->signal();
            return;
        }

        /* 
         *   add a cleanup handler: on exit, we need to signal the 'ready'
         *   event so that any other threads waiting for the socket will
         *   unblock 
         */
        oss_debug_log("starting socket monitor thread %lx", (long)tid);
        pthread_cleanup_push(thread_cleanup, this);

        /* loop as long as the socket is open */
        for (;;)
        {
            /* 
             *   Wait for the socket to go into blocking mode.  Unix doesn't
             *   have an "inverse select" function that blocks while the
             *   handle is unblocked, so we have to roll our own mechanism
             *   here, using a separate event set up for this purpose.  The
             *   socket signals this event each time it encounters an
             *   EWOULDBLOCK error in a send/recv. 
             */
            s->blocked_evt->wait();

#if 1
            /* 
             *   Wait for the socket to become ready.  Also poll the quit
             *   notification pipe, so that we'll wake up as soon as our
             *   socket has been closed locally.  
             */
            pollfd fd[2];
            fd[0].fd = s->s;
            fd[0].events = (s->wouldblock_sending ? POLLOUT : POLLIN | POLLPRI)
                           | POLLHUP;
            fd[1].fd = qpipe[0];
            fd[1].events = POLLIN;

            /* wait; if that fails, terminate the thread */
            if (poll(fd, 2, -1) < 0)
            {
                if (errno != EINTR)
                    break;
            }

            /* check to see if the socket is ready, or if it's been closed */
            if (fd[1].revents != 0)
            {
                /* quit event - exit the loop */
                break;
            }
            else if (fd[0].revents != 0)
            {
                /* ready - reset the 'blocked' event, and signal 'ready' */
                s->blocked_evt->reset();
                s->ready_evt->signal();
            }
            else
            {
                /* not ready - reset 'ready' and signal 'blocked' */
                s->ready_evt->reset();
                s->blocked_evt->signal();
            }
#else
            /* initialize a selection set for the socket */
            fd_set rfds, wfds;
            FD_ZERO(&rfds);
            FD_ZERO(&wfds);

            /* add the socket to the appropriate sets */
            FD_SET(s->s, s->wouldblock_sending ? &wfds : &rfds);

            /* wait for the socket to become ready */
            if (select(s->s + 1, &rfds, &wfds, 0, 0) <= 0)
                break;

            /* 
             *   if the socket has an exception, give up - the socket must
             *   have been closed or reset, in which case the monitor thread
             *   is no longer useful
             */
            if (FD_ISSET(s->s, &efds))
                break;

            /* if the socket selector fired, the socket is ready */
            if (FD_ISSET(s->s, &rfds) || FD_ISSET(s->s, &wfds))
            {
                /* reset the 'blocked' event, and signal 'ready' */
                s->blocked_evt->reset();
                s->ready_evt->signal();
            }
            else
            {
                /* reset 'ready' and signal 'blocked' */
                s->ready_evt->reset();
                s->blocked_evt->signal();
            }
#endif
        }

        /* pop and invoke the cleanup handler */
        pthread_cleanup_pop(TRUE);
    }